

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergesort_lcp.cpp
# Opt level: O1

void mergesort_lcp_3way(uchar **strings,size_t n)

{
  size_t __size;
  MergeResult MVar1;
  undefined8 in_RAX;
  ostream *poVar2;
  lcp_t *lcp_input;
  lcp_t *lcp_output;
  uchar **strings_output;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                      __debug_indent_str_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"mergesort_lcp_3way",0x12);
  uStack_38 = CONCAT17(10,(undefined7)uStack_38);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)((long)&uStack_38 + 7),1);
  __size = n * 8;
  lcp_input = (lcp_t *)malloc(__size);
  lcp_output = (lcp_t *)malloc(__size);
  strings_output = (uchar **)malloc(__size);
  MVar1 = mergesort_lcp_3way<false>(strings,strings_output,lcp_input,lcp_output,n);
  if (MVar1 == SortedInTemp) {
    memcpy(strings,strings_output,__size);
  }
  free(lcp_input);
  free(lcp_output);
  free(strings_output);
  return;
}

Assistant:

void
mergesort_lcp_3way(unsigned char** strings, size_t n)
{
	debug() << __func__ << '\n';
	lcp_t* lcp_input = (lcp_t*) malloc(n*sizeof(lcp_t));
	lcp_t* lcp_tmp   = (lcp_t*) malloc(n*sizeof(lcp_t));
	unsigned char** input_tmp = (unsigned char**)
		malloc(n*sizeof(unsigned char*));
	const MergeResult m = mergesort_lcp_3way<false>(strings, input_tmp,
			lcp_input, lcp_tmp, n);
	if (m == SortedInTemp) {
		(void) memcpy(strings, input_tmp, n*sizeof(unsigned char*));
	}
	free(lcp_input);
	free(lcp_tmp);
	free(input_tmp);
}